

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.cpp
# Opt level: O0

void llvm::install_bad_alloc_error_handler(fatal_error_handler_t handler,void *user_data)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> Lock;
  void *user_data_local;
  fatal_error_handler_t handler_local;
  
  Lock._M_device = (mutex_type *)user_data;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&BadAllocErrorHandlerMutex);
  if (ErrorHandler_abi_cxx11_ != (fatal_error_handler_t)0x0) {
    __assert_fail("!ErrorHandler && \"Bad alloc error handler already registered!\\n\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ErrorHandling.cpp"
                  ,0x86,"void llvm::install_bad_alloc_error_handler(fatal_error_handler_t, void *)")
    ;
  }
  BadAllocErrorHandlerUserData = Lock._M_device;
  BadAllocErrorHandler_abi_cxx11_ = handler;
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void llvm::install_bad_alloc_error_handler(fatal_error_handler_t handler,
                                           void *user_data) {
#if LLVM_ENABLE_THREADS == 1
  std::lock_guard<std::mutex> Lock(BadAllocErrorHandlerMutex);
#endif
  assert(!ErrorHandler && "Bad alloc error handler already registered!\n");
  BadAllocErrorHandler = handler;
  BadAllocErrorHandlerUserData = user_data;
}